

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_encoder.cc
# Opt level: O2

bool __thiscall draco::PlyEncoder::EncodeToFile(PlyEncoder *this,PointCloud *pc,string *file_name)

{
  bool bVar1;
  EncoderBuffer buffer;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40 [2];
  
  FileWriterFactory::OpenWriter((string *)local_50);
  if ((long *)local_50._0_8_ == (long *)0x0) {
    bVar1 = false;
  }
  else {
    EncoderBuffer::EncoderBuffer((EncoderBuffer *)(local_50 + 8));
    bVar1 = EncodeToBuffer(this,pc,(EncoderBuffer *)(local_50 + 8));
    if (bVar1) {
      (**(code **)(*(long *)local_50._0_8_ + 0x10))
                (local_50._0_8_,local_50._8_8_,local_40[0]._M_allocated_capacity - local_50._8_8_);
    }
    EncoderBuffer::~EncoderBuffer((EncoderBuffer *)(local_50 + 8));
    if ((long *)local_50._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_50._0_8_ + 8))();
    }
  }
  return bVar1;
}

Assistant:

bool PlyEncoder::EncodeToFile(const PointCloud &pc,
                              const std::string &file_name) {
  std::unique_ptr<FileWriterInterface> file =
      FileWriterFactory::OpenWriter(file_name);
  if (!file) {
    return false;  // File couldn't be opened.
  }
  // Encode the mesh into a buffer.
  EncoderBuffer buffer;
  if (!EncodeToBuffer(pc, &buffer)) {
    return false;
  }
  // Write the buffer into the file.
  file->Write(buffer.data(), buffer.size());
  return true;
}